

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureBorderClampTests.cpp
# Opt level: O1

void deqp::gles31::Functional::anon_unknown_1::generateDummyCompressedData
               (CompressedTexture *dst,CompressedTexFormat *format)

{
  pointer puVar1;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  Random rnd;
  IVec3 blockPixelSize;
  deRandom local_44;
  int local_34;
  int local_30;
  int local_2c;
  
  iVar3 = tcu::getBlockSize(*format);
  tcu::getBlockPixelSize((CompressedTexFormat)&local_34);
  uVar7 = ((dst->m_height + local_30 + -1) / local_30) * ((dst->m_width + local_34 + -1) / local_34)
          * ((dst->m_depth + local_2c + -1) / local_2c);
  bVar2 = tcu::isAstcFormat(*format);
  if (bVar2) {
    if (0 < (int)uVar7) {
      lVar5 = 0;
      do {
        puVar1 = (dst->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start + (int)lVar5;
        puVar1[0] = 0xfc;
        puVar1[1] = 0xfd;
        puVar1[2] = 0xff;
        puVar1[3] = 0xff;
        puVar1[4] = 0xff;
        puVar1[5] = 0xff;
        puVar1[6] = 0xff;
        puVar1[7] = 0xff;
        puVar1[8] = 0xdf;
        puVar1[9] = 0xfb;
        puVar1[10] = '\x1c';
        puVar1[0xb] = 0xce;
        puVar1[0xc] = '6';
        puVar1[0xd] = 0xfb;
        puVar1[0xe] = 0xa0;
        puVar1[0xf] = 0xae;
        lVar5 = lVar5 + 0x10;
      } while ((ulong)uVar7 << 4 != lVar5);
    }
  }
  else {
    deRandom_init(&local_44,0xabc);
    if (0 < (int)(uVar7 * iVar3)) {
      uVar6 = 0;
      do {
        dVar4 = deRandom_getUint32(&local_44);
        (dst->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start[uVar6] = (uchar)dVar4;
        uVar6 = uVar6 + 1;
      } while (uVar7 * iVar3 != uVar6);
    }
  }
  return;
}

Assistant:

void generateDummyCompressedData (tcu::CompressedTexture& dst, const tcu::CompressedTexFormat& format)
{
	const int			blockByteSize	= tcu::getBlockSize(format);
	const tcu::IVec3	blockPixelSize	= tcu::getBlockPixelSize(format);
	const tcu::IVec3	numBlocks		(getDimensionNumBlocks(dst.getWidth(),    blockPixelSize.x()),
										 getDimensionNumBlocks(dst.getHeight(),   blockPixelSize.y()),
										 getDimensionNumBlocks(dst.getDepth(),    blockPixelSize.z()));
	const int			numTotalBlocks	= numBlocks.x() * numBlocks.y() * numBlocks.z();
	const int			dataSize		= numTotalBlocks * blockByteSize;

	DE_ASSERT(dst.getDataSize() == dataSize);

	if (tcu::isAstcFormat(format))
	{
		// generate data that is valid in LDR mode
		const int		BLOCK_SIZE			= 16;
		const deUint8	block[BLOCK_SIZE]	= { 252, 253, 255, 255, 255, 255, 255, 255, 223, 251, 28, 206, 54, 251, 160, 174 };

		DE_ASSERT(blockByteSize == BLOCK_SIZE);
		for (int ndx = 0; ndx < numTotalBlocks; ++ndx)
			deMemcpy((deUint8*)dst.getData() + ndx * BLOCK_SIZE, block, BLOCK_SIZE);
	}
	else
	{
		// any data is ok
		de::Random rnd(0xabc);

		for (int ndx = 0; ndx < dataSize; ++ndx)
			((deUint8*)dst.getData())[ndx] = rnd.getUint8();
	}
}